

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_classtrait.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseClassTrait
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  pointer puVar1;
  Token *classTokId;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var2;
  Lexer *lexer;
  _List_node_base *p_Var3;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var4;
  undefined1 auVar5 [8];
  bool bVar6;
  bool bVar7;
  Lexer *this_00;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *in_RDX;
  _List_node_base *p_Var8;
  pointer __p;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  functions;
  TemplateDecls local_c8;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *local_a8;
  undefined1 local_a0 [8];
  Position local_98;
  Position local_78;
  Position local_60;
  undefined1 local_48 [16];
  
  puVar1 = (caps->_M_t).
           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
           ._M_t.
           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78.line =
       *(size_t *)
        &puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_78.startIndex =
       *(size_t *)
        &puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_78.endIndex =
       *(size_t *)
        &puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_a8 = in_RDX;
  sanityExpect((Parser *)caps,TOK_KW_TRAIT);
  local_c8.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = Token::operator==((Token *)(caps->_M_t).
                                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                     _M_head_impl[3].required.
                                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                            TOK_OP_TEMPL_BRACKET_OPEN);
  if (bVar6) {
    parseTemplateDecl((TemplateDecls *)(local_a0 + 8),(Parser *)caps);
    local_c8.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98.line;
    local_c8.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98.startIndex;
    local_c8.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98.endIndex;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node._M_size = 0;
    local_98.line = 0;
    local_98.startIndex = 0;
    local_98.endIndex = 0;
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
               *)&functions);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector((TemplateDecls *)(local_a0 + 8));
  }
  classTokId = (Token *)(caps->_M_t).
                        super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                        .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].
                        required.
                        super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = expect((Parser *)caps,TOK_ID);
  if (bVar6) {
    bVar6 = false;
  }
  else {
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(0x38);
    p_Var8 = (_List_node_base *)(classTokId->pos).endIndex;
    *(undefined2 *)
     &(functions.
       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_next = 2;
    *(undefined4 *)
     ((long)&(functions.
              super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 4) = 8;
    p_Var3 = (_List_node_base *)(classTokId->pos).startIndex;
    (functions.
     super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
     ._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
         (_List_node_base *)(classTokId->pos).line;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[1]._M_next = p_Var3;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev = p_Var8;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[3]._M_next = (_List_node_base *)0x0;
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    if (functions.
        super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&functions,
                 (Error<pfederc::SyntaxErrorCode> *)
                 functions.
                 super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next);
    }
    bVar6 = true;
  }
  bVar7 = expect((Parser *)caps,TOK_OP_DCL);
  if (!bVar7) {
    puVar1 = (caps->_M_t).
             super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
             .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(0x38);
    _Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    *(undefined2 *)
     &(functions.
       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_next = 2;
    *(undefined4 *)
     ((long)&(functions.
              super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 4) = 8;
    _Var4.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    (functions.
     super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
     ._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
         (_List_node_base *)
         puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[1]._M_next =
         (_List_node_base *)
         _Var4.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev =
         (_List_node_base *)
         _Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[3]._M_next = (_List_node_base *)0x0;
    generateError((Parser *)(local_48 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_48 + 8));
    if (functions.
        super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&functions,
                 (Error<pfederc::SyntaxErrorCode> *)
                 functions.
                 super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next);
    }
  }
  parseExpression((Parser *)local_a0,(Precedence)caps);
  auVar5 = local_a0;
  if (local_a0 == (undefined1  [8])0x0) {
    bVar6 = true;
  }
  else if (*(int *)&(((string *)((long)local_a0 + 0x18))->_M_dataplus)._M_p == 0x12) {
    if (*(_func_int ***)local_a0 != (_func_int **)&PTR__BiOpExpr_00127990) {
      __cxa_bad_cast();
    }
    if ((short)((string *)((long)local_a0 + 0x38))->_M_string_length == 0x2e) {
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(0x38);
      p_Var8 = *(_List_node_base **)((long)&((string *)((long)auVar5 + 0x18))->field_2 + 8);
      *(undefined2 *)
       &(functions.
         super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next)->_M_next = 2;
      *(undefined4 *)
       ((long)&(functions.
                super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 4) = 0x1a;
      p_Var3 = (_List_node_base *)(((string *)((long)auVar5 + 0x18))->field_2)._M_allocated_capacity
      ;
      (functions.
       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
           (_List_node_base *)((string *)((long)auVar5 + 0x18))->_M_string_length;
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[1]._M_next = p_Var3;
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev = p_Var8;
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x0;
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x0;
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next[3]._M_next = (_List_node_base *)0x0;
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      if (functions.
          super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&functions,
                   (Error<pfederc::SyntaxErrorCode> *)
                   functions.
                   super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next);
      }
    }
  }
  p_Var8 = (_List_node_base *)0x1;
  bVar7 = expect((Parser *)caps,TOK_EOL);
  if (!bVar7) {
    puVar1 = (caps->_M_t).
             super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
             .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(0x38);
    _Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    *(undefined2 *)
     &(functions.
       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_next = 2;
    *(undefined4 *)
     ((long)&(functions.
              super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 4) = 0xf;
    _Var4.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    (functions.
     super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
     ._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
         (_List_node_base *)
         puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[1]._M_next =
         (_List_node_base *)
         _Var4.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev =
         (_List_node_base *)
         _Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next[3]._M_next = (_List_node_base *)0x0;
    generateError((Parser *)((long)&local_60 + 0x10U),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               ((long)&local_60 + 0x10U));
    p_Var8 = functions.
             super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (functions.
        super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&functions,
                 (Error<pfederc::SyntaxErrorCode> *)
                 functions.
                 super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next);
      p_Var8 = functions.
               super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
    }
  }
  functions.
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node._M_size = 0;
  functions.
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&functions;
  functions.
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&functions;
  parseClassTraitBody((Parser *)caps,(bool *)p_Var8,&functions);
  bVar7 = expect((Parser *)caps,TOK_STMT);
  if (!bVar7) {
    puVar1 = (caps->_M_t).
             super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
             .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_98.line = (size_t)operator_new(0x38);
    _Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    ((Error<pfederc::SyntaxErrorCode> *)local_98.line)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)local_98.line)->err = STX_ERR_EXPECTED_STMT;
    _Var4.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    (((Error<pfederc::SyntaxErrorCode> *)local_98.line)->pos).line =
         (size_t)puVar1[3]._M_t.
                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    (((Error<pfederc::SyntaxErrorCode> *)local_98.line)->pos).startIndex =
         (size_t)_Var4.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    (((Error<pfederc::SyntaxErrorCode> *)local_98.line)->pos).endIndex =
         (size_t)_Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    (((Error<pfederc::SyntaxErrorCode> *)local_98.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)local_98.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)local_98.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)((long)&local_60 + 8U),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               ((long)&local_60 + 8U));
    if ((Error<pfederc::SyntaxErrorCode> *)local_98.line != (Error<pfederc::SyntaxErrorCode> *)0x0)
    {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)(local_a0 + 8),
                 (Error<pfederc::SyntaxErrorCode> *)local_98.line);
    }
  }
  if (bVar6) {
    this->lexer = (Lexer *)0x0;
  }
  else {
    lexer = (Lexer *)(caps->_M_t).
                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
    Position::operator+((Position *)(local_a0 + 0x28),&classTokId->pos);
    this_00 = (Lexer *)operator_new(0x80);
    TraitImplExpr::TraitImplExpr
              ((TraitImplExpr *)this_00,lexer,(Position *)(local_a0 + 8),local_a8,classTokId,
               &local_c8,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_a0,
               &functions);
    local_60.line = 0;
    this->lexer = this_00;
    std::unique_ptr<pfederc::TraitImplExpr,_std::default_delete<pfederc::TraitImplExpr>_>::
    ~unique_ptr((unique_ptr<pfederc::TraitImplExpr,_std::default_delete<pfederc::TraitImplExpr>_> *)
                &local_60);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::_M_clear(&functions.
              super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
            );
  if (local_a0 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_a0)[1])();
  }
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector(&local_c8);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseClassTrait(std::unique_ptr<Capabilities> &&caps) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_TRAIT);

  // hard errors
  bool err = false;

  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
  }

  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokId->getPosition()));
    err = true;
  }

  if (!expect(TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
  }

  std::unique_ptr<Expr> impltrait(parseExpression());
  if (!impltrait)
    err = true;
  else if (isBiOpExpr(*impltrait, TokenType::TOK_OP_COMMA)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_TRAITCLASS_IMPL, impltrait->getPosition()));
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::list<std::unique_ptr<FuncExpr>> functions;
  parseClassTraitBody(err, functions);

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
  }

  if (err)
    return nullptr;

  return std::make_unique<TraitImplExpr>(lexer,
      pos + tokId->getPosition(), std::move(caps),
      tokId, std::move(templ), std::move(impltrait), std::move(functions));
}